

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall JetHead::Socket::Socket(Socket *this,bool sock_stream)

{
  int __fd;
  undefined7 in_register_00000031;
  int on;
  
  (this->super_SelectorListener)._vptr_SelectorListener =
       (_func_int **)&PTR_processFileEvents_00130850;
  (this->super_IReaderWriter)._vptr_IReaderWriter = (_func_int **)&PTR__Socket_00130898;
  this->mConnectedAsync = false;
  this->mListener = (SocketListener *)0x0;
  this->mFd = -1;
  this->mSelector = (Selector *)0x0;
  this->mConnected = false;
  this->mPrivateData = 0;
  this->mSockStream = sock_stream;
  this->mParent = this;
  this->mReadTimeout = 0;
  (this->mLastDatagramSender).mAddr.sin_family = 2;
  (this->mLastDatagramSender).mAddr.sin_port = 0;
  (this->mLastDatagramSender).mAddr.sin_addr.s_addr = 0;
  (this->mLastDatagramSender).mLen = 0x10;
  __fd = socket(2,2 - (int)CONCAT71(in_register_00000031,sock_stream),0);
  this->mFd = __fd;
  if (__fd != -1) {
    on = 1;
    setsockopt(__fd,1,2,&on,4);
    return;
  }
  jh_log_print(1,"JetHead::Socket::Socket(bool)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
               ,0x46,"Failed to create socket");
  return;
}

Assistant:

Socket::Socket( bool sock_stream )
	:	mConnectedAsync( false ),
		mListener( NULL ),
		mFd( -1 ),
		mSelector( NULL ),
		mConnected( false ), mPrivateData( 0 ), mSockStream( sock_stream ),
		mParent(this), mReadTimeout( 0 )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	
	if ( sock_stream )
		mFd = socket( AF_INET, SOCK_STREAM, 0 );
	else
		mFd = socket( AF_INET, SOCK_DGRAM, 0 );

	if ( mFd == -1 )
	{
		LOG_ERR_FATAL( "Failed to create socket" );
		return;
	}
	
	int on = 1;
	setsockopt( mFd, SOL_SOCKET, SO_REUSEADDR, (char*)&on, sizeof(on) );
	LOG_NOISE( "fd %d", mFd );
}